

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_ObjCollectTfi(Acb_Ntk_t *p,int iObj,int fTerm)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  
  (p->vArray0).nSize = 0;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar2 = (p->vObjTrav).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar2;
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (iObj < 1) {
    if (0 < (p->vCos).nSize) {
      lVar3 = 0;
      do {
        Acb_ObjCollectTfi_rec(p,(p->vCos).pArray[lVar3],fTerm);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (p->vCos).nSize);
    }
  }
  else {
    if (0 < (p->vSuppOld).nSize) {
      lVar3 = 0;
      do {
        Acb_ObjCollectTfi_rec(p,(p->vSuppOld).pArray[lVar3],fTerm);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (p->vSuppOld).nSize);
    }
    Acb_ObjCollectTfi_rec(p,iObj,fTerm);
  }
  return &p->vArray0;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfi( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int i, Node;
    Vec_IntClear( &p->vArray0 );
    Acb_NtkIncTravId( p );
    if ( iObj > 0 )
    {
        Vec_IntForEachEntry( &p->vSuppOld, Node, i )
            Acb_ObjCollectTfi_rec( p, Node, fTerm );
        Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    }
    else
        Acb_NtkForEachCo( p, iObj, i )
            Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    return &p->vArray0;
}